

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_c21508::TransformReplace::Transform
          (string *__return_storage_ptr__,TransformReplace *this,string *input)

{
  bool bVar1;
  transform_error *this_00;
  string *str;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  string local_58;
  undefined1 local_21;
  string *local_20;
  string *input_local;
  TransformReplace *this_local;
  string *output;
  
  local_21 = 0;
  local_20 = input;
  input_local = (string *)this;
  this_local = (TransformReplace *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = cmStringReplaceHelper::Replace(&this->ReplaceHelper,local_20,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  cmAlphaNum::cmAlphaNum(&local_88,"sub-command TRANSFORM, action REPLACE: ");
  str = cmStringReplaceHelper::GetError_abi_cxx11_(&this->ReplaceHelper);
  cmAlphaNum::cmAlphaNum(&local_b8,str);
  cmStrCat<char[2]>(&local_58,&local_88,&local_b8,(char (*) [2])0xd2adeb);
  transform_error::transform_error(this_00,&local_58);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              transform_error::~transform_error);
}

Assistant:

std::string Transform(const std::string& input) override
  {
    // Scan through the input for all matches.
    std::string output;

    if (!this->ReplaceHelper.Replace(input, output)) {
      throw transform_error(cmStrCat("sub-command TRANSFORM, action REPLACE: ",
                                     this->ReplaceHelper.GetError(), "."));
    }

    return output;
  }